

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O3

Pair<Corrade::Utility::TweakableState,_long_long>
Corrade::Utility::TweakableParser<long_long>::parse(StringView value)

{
  StringView value_00;
  StringView value_01;
  longlong lVar1;
  Debug *pDVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  ulong in_RSI;
  char *in_RDI;
  StringView value_02;
  Pair<const_char_*,_int> PVar5;
  BasicStringView<const_char> value_03;
  Pair<Corrade::Utility::TweakableState,_long_long> PVar6;
  char *end;
  char *in_stack_ffffffffffffff98;
  char *pcVar7;
  Warning local_50;
  char *local_28;
  
  value_00._sizePlusFlags = (size_t)in_RDI;
  value_00._data = in_stack_ffffffffffffff98;
  pcVar7 = in_RDI;
  PVar5 = anon_unknown_14::integerBase(value_00);
  lVar1 = strtoll(PVar5._first,&local_28,PVar5._second);
  if (local_28 == in_RDI) {
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_50.super_Debug,"Utility::TweakableParser:");
    value_02._sizePlusFlags = in_RSI;
    value_02._data = in_RDI;
    pDVar2 = Debug::operator<<(pDVar2,value_02);
    Debug::operator<<(pDVar2,"is not an integer literal");
  }
  else if ((in_RSI & 0x3fffffffffffffff) < 2) {
LAB_0015ad8f:
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_50.super_Debug,"Utility::TweakableParser:");
    value_01._sizePlusFlags = in_RSI;
    value_01._data = pcVar7;
    pDVar2 = Debug::operator<<(pDVar2,value_01);
    Debug::operator<<(pDVar2,"has an unexpected suffix, expected ll");
  }
  else {
    pcVar3 = Containers::BasicStringView<const_char>::operator[]
                       ((BasicStringView<const_char> *)&stack0xffffffffffffffa0,
                        (in_RSI & 0x3fffffffffffffff) - 1);
    if (*pcVar3 != 'l') {
      pcVar3 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&stack0xffffffffffffffa0,
                          (in_RSI & 0x3fffffffffffffff) - 1);
      if (*pcVar3 != 'L') {
        pcVar3 = Containers::BasicStringView<const_char>::operator[]
                           ((BasicStringView<const_char> *)&stack0xffffffffffffffa0,
                            (in_RSI & 0x3fffffffffffffff) - 2);
        if (*pcVar3 != 'l') {
          pcVar3 = Containers::BasicStringView<const_char>::operator[]
                             ((BasicStringView<const_char> *)&stack0xffffffffffffffa0,
                              (in_RSI & 0x3fffffffffffffff) - 2);
          if (*pcVar3 != 'L') goto LAB_0015ad8f;
        }
      }
    }
    if (local_28 == pcVar7 + ((in_RSI & 0x3fffffffffffffff) - 2)) {
      uVar4 = CONCAT71((int7)((ulong)(pcVar7 + ((in_RSI & 0x3fffffffffffffff) - 2)) >> 8),1);
      goto LAB_0015aee8;
    }
    Warning::Warning(&local_50,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_50.super_Debug,
                               "Utility::TweakableParser: unexpected characters");
    value_03 = Containers::BasicStringView<const_char>::suffix
                         ((BasicStringView<const_char> *)&stack0xffffffffffffffa0,local_28);
    pDVar2 = Debug::operator<<(pDVar2,value_03);
    Debug::operator<<(pDVar2,"after an integer literal");
  }
  Warning::~Warning(&local_50);
  uVar4 = CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
  lVar1 = 0;
LAB_0015aee8:
  PVar6._second = lVar1;
  PVar6._0_8_ = uVar4;
  return PVar6;
}

Assistant:

Containers::Pair<TweakableState, long long> TweakableParser<long long>::parse(Containers::StringView value) {
    const Containers::Pair<const char*, int> valueBase = integerBase(value);
    char* end;
    const long long result = std::strtoll(valueBase.first(), &end, valueBase.second());

    if(end == value.begin()) {
        Warning{} << "Utility::TweakableParser:" << value << "is not an integer literal";
        return {TweakableState::Recompile, {}};
    }

    if(value.size() < 2 ||
      (value[value.size() - 1] != 'l' && value[value.size() - 1] != 'L' &&
       value[value.size() - 2] != 'l' && value[value.size() - 2] != 'L'))
    {
        Warning{} << "Utility::TweakableParser:" << value << "has an unexpected suffix, expected ll";
        return {TweakableState::Recompile, {}};
    }

    if(end != value.end() - 2) {
        Warning{} << "Utility::TweakableParser: unexpected characters" << value.suffix(end) << "after an integer literal";
        return {TweakableState::Recompile, {}};
    }

    return {TweakableState::Success, result};
}